

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::Mock::UnregisterCallReaction(void *mock_obj)

{
  GTestMutexLock local_18;
  MutexLock l;
  void *mock_obj_local;
  
  l.mutex_ = (MutexBase *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock(&local_18,(MutexBase *)internal::g_gmock_mutex);
  std::
  map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  ::erase((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
           *)(anonymous_namespace)::g_uninteresting_call_reaction,&l.mutex_);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_uninteresting_call_reaction.erase(mock_obj);
}